

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
DisarmC4IRCCommand::trigger
          (DisarmC4IRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  PlayerInfo *pPVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  basic_string_view<char,_std::char_traits<char>_> *pbVar8;
  char *args_2;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_t local_78;
  undefined1 local_70 [48];
  size_type local_40;
  char *local_38;
  
  pcVar9 = nick._M_str;
  pbVar8 = (basic_string_view<char,_std::char_traits<char>_> *)nick._M_len;
  pcVar5 = channel._M_str;
  sVar6 = channel._M_len;
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,pbVar8,pcVar9,0x34,"Error: Too Few Parameters. Syntax: disarmC4 <player>");
    return;
  }
  args_2 = (char *)pbVar8;
  lVar2 = Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    lVar2 = RenX::Core::getServerCount();
    if (lVar2 != 0) {
      local_78 = parameters._M_len;
      uVar7 = 1;
      bVar11 = false;
      do {
        uVar3 = RenX::getCore();
        pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)pPVar4);
        if (cVar1 != '\0') {
          lVar2 = RenX::Server::getPlayerByPartName(pPVar4,local_78,parameters._M_str);
          if (lVar2 == 0) {
            args_2 = "Error: Player not found.";
            Jupiter::IRC::Client::sendNotice(source,pbVar8,pcVar9,0x18);
          }
          else {
            cVar1 = RenX::Server::disarmC4(pPVar4);
            if (cVar1 == '\0') {
              args_2 = "Error: Server does not support disarms.";
              Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,0x27);
            }
            else {
              local_40 = 0x14;
              local_38 = "All C4 belonging to ";
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)local_70);
              local_70._32_8_ = 0x15;
              local_70._40_8_ = "\x03 have been disarmed.";
              jessilib::
              join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                        (&local_98,(jessilib *)&local_40,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_70 + 0x20),
                         (basic_string_view<char,_std::char_traits<char>_> *)args_2);
              args_2 = local_98._M_dataplus._M_p;
              Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,local_98._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_70._0_8_ != (long)local_70 + 0x10) {
                operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
              }
            }
          }
          bVar11 = true;
        }
        uVar10 = (ulong)uVar7;
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar10);
      if (bVar11) {
        return;
      }
    }
    Jupiter::IRC::Client::sendNotice
              (source,pbVar8,pcVar9,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
  }
  return;
}

Assistant:

void DisarmC4IRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			int type = chan->getType();
			RenX::PlayerInfo *player;
			bool match = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					match = true;
					player = server->getPlayerByPartName(parameters);
					if (player != nullptr)
					{
						if (server->disarmC4(*player))
							source->sendMessage(channel, jessilib::join<std::string>("All C4 belonging to "sv, RenX::getFormattedPlayerName(*player), IRCCOLOR " have been disarmed."sv));
						else
							source->sendMessage(channel, "Error: Server does not support disarms."sv);
					}
					else
						source->sendNotice(nick, "Error: Player not found."sv);
				}
			}
			if (match == false)
				source->sendNotice(nick, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: disarmC4 <player>"sv);
}